

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

Vec4 tcu::sampleCubeSeamlessLinear
               (ConstPixelBufferAccess (*faceAccesses) [6],CubeFace baseFace,Sampler *sampler,
               float s,float t,int depth)

{
  int size;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  long lVar1;
  float fVar2;
  float fVar3;
  Vector<float,_4> VVar4;
  Vec4 VVar5;
  Vec4 sampleColors [4];
  float local_118;
  float local_114;
  Vector<float,_4> local_108 [4];
  tcu local_c8 [16];
  tcu local_b8 [16];
  tcu local_a8 [16];
  tcu local_98 [16];
  tcu local_88 [16];
  tcu local_78 [16];
  tcu local_68 [16];
  tcu local_58 [16];
  tcu local_48 [16];
  tcu local_38 [16];
  
  local_118 = t;
  local_114 = s;
  if (*(char *)(CONCAT44(in_register_0000000c,depth) + 0x18) == '\x01') {
    lVar1 = CONCAT44(in_register_0000000c,depth);
    size = (*(ConstPixelBufferAccess (*) [6])CONCAT44(in_register_00000034,baseFace))[0].m_size.
           m_data[0];
    local_114 = unnormalize(*(WrapMode *)CONCAT44(in_register_0000000c,depth),s,size);
    local_118 = unnormalize(*(WrapMode *)(lVar1 + 4),t,size);
  }
  lVar1 = 0;
  do {
    Vector<float,_4>::Vector((Vector<float,_4> *)((long)local_108[0].m_data + lVar1));
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x40);
  getCubeLinearSamples
            ((ConstPixelBufferAccess (*) [6])CONCAT44(in_register_00000034,baseFace),
             (CubeFace)sampler,local_114,local_118,(int)local_108,
             (Vec4 (*) [4])CONCAT44(in_register_0000000c,depth));
  fVar2 = floorf(local_114 + -0.5);
  fVar2 = (local_114 + -0.5) - fVar2;
  fVar3 = floorf(local_118 + -0.5);
  fVar3 = (local_118 + -0.5) - fVar3;
  operator*(local_68,1.0 - fVar2,local_108);
  operator*(local_58,1.0 - fVar3,(Vector<float,_4> *)local_68);
  operator*(local_88,fVar2,local_108 + 1);
  operator*(local_78,1.0 - fVar3,(Vector<float,_4> *)local_88);
  operator+(local_48,(Vector<float,_4> *)local_58,(Vector<float,_4> *)local_78);
  operator*(local_a8,1.0 - fVar2,local_108 + 2);
  operator*(local_98,fVar3,(Vector<float,_4> *)local_a8);
  operator+(local_38,(Vector<float,_4> *)local_48,(Vector<float,_4> *)local_98);
  operator*(local_c8,fVar2,local_108 + 3);
  operator*(local_b8,fVar3,(Vector<float,_4> *)local_c8);
  VVar4 = operator+((tcu *)faceAccesses,(Vector<float,_4> *)local_38,(Vector<float,_4> *)local_b8);
  VVar5.m_data[0] = VVar4.m_data[0];
  VVar5.m_data[1] = VVar4.m_data[1];
  VVar5.m_data[2] = VVar4.m_data[2];
  VVar5.m_data[3] = VVar4.m_data[3];
  return (Vec4)VVar5.m_data;
}

Assistant:

static Vec4 sampleCubeSeamlessLinear (const ConstPixelBufferAccess (&faceAccesses)[CUBEFACE_LAST], CubeFace baseFace, const Sampler& sampler, float s, float t, int depth)
{
	DE_ASSERT(faceAccesses[0].getWidth() == faceAccesses[0].getHeight());

	int		size	= faceAccesses[0].getWidth();
	// Non-normalized coordinates.
	float	u		= s;
	float	v		= t;

	if (sampler.normalizedCoords)
	{
		u = unnormalize(sampler.wrapS, s, size);
		v = unnormalize(sampler.wrapT, t, size);
	}

	// Get sample colors.

	Vec4 sampleColors[4];
	getCubeLinearSamples(faceAccesses, baseFace, u, v, depth, sampleColors);

	// Interpolate.

	float a = deFloatFrac(u-0.5f);
	float b = deFloatFrac(v-0.5f);

	return (sampleColors[0]*(1.0f-a)*(1.0f-b)) +
		   (sampleColors[1]*(     a)*(1.0f-b)) +
		   (sampleColors[2]*(1.0f-a)*(     b)) +
		   (sampleColors[3]*(     a)*(     b));
}